

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_state.cpp
# Opt level: O0

dht_state * libtorrent::dht::read_dht_state(dht_state *__return_storage_ptr__,bdecode_node *e)

{
  bdecode_node *pbVar1;
  bool bVar2;
  type_t tVar3;
  bdecode_node *n;
  bdecode_node *n_00;
  char *in_R8;
  string_view key;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  local_128;
  string_view local_110;
  undefined1 local_100 [8];
  bdecode_node nodes_1;
  string_view local_a8;
  undefined1 local_98 [8];
  bdecode_node nodes;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  node_ids_t local_38;
  undefined1 local_19;
  bdecode_node *local_18;
  bdecode_node *e_local;
  dht_state *ret;
  
  local_19 = 0;
  local_18 = e;
  e_local = (bdecode_node *)__return_storage_ptr__;
  dht_state::dht_state(__return_storage_ptr__);
  tVar3 = bdecode_node::type(local_18);
  pbVar1 = local_18;
  if (tVar3 == dict_t) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"node-id");
    key._M_str = in_R8;
    key._M_len = (size_t)local_48._M_str;
    extract_node_ids(&local_38,(dht *)pbVar1,(bdecode_node *)local_48._M_len,key);
    ::std::
    vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    ::operator=(&__return_storage_ptr__->nids,&local_38);
    ::std::
    vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    ::~vector(&local_38);
    pbVar1 = local_18;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"nodes");
    bdecode_node::dict_find_list((bdecode_node *)local_98,pbVar1,local_a8);
    bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_98);
    if (bVar2) {
      libtorrent::aux::read_endpoint_list<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
                ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                  *)&nodes_1.m_size,(aux *)local_98,n);
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
      ::operator=(&__return_storage_ptr__->nodes,
                  (vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                   *)&nodes_1.m_size);
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
      ::~vector((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 *)&nodes_1.m_size);
    }
    bdecode_node::~bdecode_node((bdecode_node *)local_98);
    pbVar1 = local_18;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,"nodes6");
    bdecode_node::dict_find_list((bdecode_node *)local_100,pbVar1,local_110);
    bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_100);
    if (bVar2) {
      libtorrent::aux::read_endpoint_list<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
                (&local_128,(aux *)local_100,n_00);
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
      ::operator=(&__return_storage_ptr__->nodes6,&local_128);
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
      ::~vector(&local_128);
    }
    bdecode_node::~bdecode_node((bdecode_node *)local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

dht_state read_dht_state(bdecode_node const& e)
	{
		dht_state ret;

		if (e.type() != bdecode_node::dict_t) return ret;

		ret.nids = extract_node_ids(e, "node-id");

		if (bdecode_node const nodes = e.dict_find_list("nodes"))
			ret.nodes = aux::read_endpoint_list<udp::endpoint>(nodes);
		if (bdecode_node const nodes = e.dict_find_list("nodes6"))
			ret.nodes6 = aux::read_endpoint_list<udp::endpoint>(nodes);
		return ret;
	}